

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

void __thiscall
boost::python::
class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
          (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,init_base<boost::python::init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                 *i)

{
  type_info local_30;
  type_info local_28;
  
  converter::registry::insert
            (converter::shared_ptr_from_python<HFSubConsumer,_boost::shared_ptr>::convertible,
             converter::shared_ptr_from_python<HFSubConsumer,_boost::shared_ptr>::construct,
             (type_info)"N5boost10shared_ptrI13HFSubConsumerEE",
             converter::expected_from_python_type_direct<HFSubConsumer>::get_pytype);
  converter::registry::insert
            (converter::shared_ptr_from_python<HFSubConsumer,_std::shared_ptr>::convertible,
             converter::shared_ptr_from_python<HFSubConsumer,_std::shared_ptr>::construct,
             (type_info)"St10shared_ptrI13HFSubConsumerE",
             converter::expected_from_python_type_direct<HFSubConsumer>::get_pytype);
  objects::register_dynamic_id_aux
            ((type_info)0x362857,objects::polymorphic_id_generator<HFSubConsumer>::execute);
  converter::registry::insert
            (converter::shared_ptr_from_python<HFSubConsumer_python,_boost::shared_ptr>::convertible
             ,converter::shared_ptr_from_python<HFSubConsumer_python,_boost::shared_ptr>::construct,
             (type_info)"N5boost10shared_ptrI20HFSubConsumer_pythonEE",
             converter::expected_from_python_type_direct<HFSubConsumer_python>::get_pytype);
  converter::registry::insert
            (converter::shared_ptr_from_python<HFSubConsumer_python,_std::shared_ptr>::convertible,
             converter::shared_ptr_from_python<HFSubConsumer_python,_std::shared_ptr>::construct,
             (type_info)"St10shared_ptrI20HFSubConsumer_pythonE",
             converter::expected_from_python_type_direct<HFSubConsumer_python>::get_pytype);
  objects::register_dynamic_id_aux
            ((type_info)"20HFSubConsumer_python",
             objects::polymorphic_id_generator<HFSubConsumer_python>::execute);
  mpl::aux::for_each_impl<false>::
  execute<boost::mpl::aux::sel_iter<HFSubConsumer,0>,boost::mpl::aux::sel_iter<HFSubConsumer,1>,std::add_pointer<mpl_::arg<_1>>,boost::python::objects::register_base_of<HFSubConsumer_python>>
            (0,0,0);
  local_28.m_base_type = "13HFSubConsumer";
  local_30.m_base_type = "20HFSubConsumer_python";
  objects::copy_class_object(&local_28,&local_30);
  objects::class_base::set_instance_size((class_base *)this,0x3e0);
  detail::define_class_init_helper<0>::
  apply<boost::python::class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector2<HighFreqDataType,int>,boost::mpl::size<boost::mpl::vector2<HighFreqDataType,int>>>
            (this,&local_28,&local_30,i->m_doc,&i->m_keywords);
  return;
}

Assistant:

inline void initialize(DefVisitor const& i)
    {
        metadata::register_(); // set up runtime metadata/conversions
        
        typedef typename metadata::holder holder;
        this->set_instance_size( objects::additional_instance_size<holder>::value );
        
        this->def(i);
    }